

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanosvgrast.h
# Opt level: O0

void nsvg__fillScanline(uchar *scanline,int len,int x0,int x1,int maxWeight,int *xmin,int *xmax)

{
  int iVar1;
  int local_30;
  int local_2c;
  int j;
  int i;
  int *xmin_local;
  int maxWeight_local;
  int x1_local;
  int x0_local;
  int len_local;
  uchar *scanline_local;
  
  local_2c = x0 >> 10;
  iVar1 = x1 >> 10;
  if (local_2c < *xmin) {
    *xmin = local_2c;
  }
  if (*xmax < iVar1) {
    *xmax = iVar1;
  }
  if ((local_2c < len) && (-1 < iVar1)) {
    if (local_2c == iVar1) {
      scanline[local_2c] = scanline[local_2c] + (char)((x1 - x0) * maxWeight >> 10);
    }
    else {
      if (local_2c < 0) {
        local_2c = -1;
      }
      else {
        scanline[local_2c] =
             scanline[local_2c] + (char)((int)((0x400 - (x0 & 0x3ffU)) * maxWeight) >> 10);
      }
      local_30 = len;
      if (iVar1 < len) {
        scanline[iVar1] = scanline[iVar1] + (char)((int)((x1 & 0x3ffU) * maxWeight) >> 10);
        local_30 = iVar1;
      }
      while (local_2c = local_2c + 1, local_2c < local_30) {
        scanline[local_2c] = scanline[local_2c] + (char)maxWeight;
      }
    }
  }
  return;
}

Assistant:

static void nsvg__fillScanline(unsigned char* scanline, int len, int x0, int x1, int maxWeight, int* xmin, int* xmax)
{
	int i = x0 >> NSVG__FIXSHIFT;
	int j = x1 >> NSVG__FIXSHIFT;
	if (i < *xmin) *xmin = i;
	if (j > *xmax) *xmax = j;
	if (i < len && j >= 0) {
		if (i == j) {
			// x0,x1 are the same pixel, so compute combined coverage
			scanline[i] = (unsigned char)(scanline[i] + ((x1 - x0) * maxWeight >> NSVG__FIXSHIFT));
		} else {
			if (i >= 0) // add antialiasing for x0
				scanline[i] = (unsigned char)(scanline[i] + (((NSVG__FIX - (x0 & NSVG__FIXMASK)) * maxWeight) >> NSVG__FIXSHIFT));
			else
				i = -1; // clip

			if (j < len) // add antialiasing for x1
				scanline[j] = (unsigned char)(scanline[j] + (((x1 & NSVG__FIXMASK) * maxWeight) >> NSVG__FIXSHIFT));
			else
				j = len; // clip

			for (++i; i < j; ++i) // fill pixels between x0 and x1
				scanline[i] = (unsigned char)(scanline[i] + maxWeight);
		}
	}
}